

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint node_index)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  
  fVar2 = (this->m_nodes).m_p[node_index].m_variance;
  uVar3 = this->m_heap_size;
  uVar1 = uVar3 + 1;
  this->m_heap_size = uVar1;
  uVar5 = (ulong)uVar1;
  if ((this->m_heap).m_size <= uVar1) {
    vector<unsigned_int>::resize(&this->m_heap,uVar3 + 2,false);
  }
  while (puVar4 = (this->m_heap).m_p, 1 < (uint)uVar5) {
    if (fVar2 < (this->m_nodes).m_p[puVar4[uVar5 >> 1]].m_variance) break;
    puVar4[uVar5] = puVar4[uVar5 >> 1];
    uVar5 = uVar5 >> 1;
  }
  puVar4[uVar5] = node_index;
  return;
}

Assistant:

void insert_heap(uint node_index) {
    const float variance = m_nodes[node_index].m_variance;
    uint pos = ++m_heap_size;

    if (m_heap_size >= m_heap.size())
      m_heap.resize(m_heap_size + 1);

    for (;;) {
      uint parent = pos >> 1;
      if (!parent)
        break;

      float parent_variance = m_nodes[m_heap[parent]].m_variance;
      if (parent_variance > variance)
        break;

      m_heap[pos] = m_heap[parent];

      pos = parent;
    }

    m_heap[pos] = node_index;
  }